

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

TracedArray * __thiscall
perfetto::TracedValue::WriteArray(TracedArray *__return_storage_ptr__,TracedValue *this)

{
  DebugAnnotation *annotation;
  EventContext *event_context;
  CheckedScope *parent_scope;
  TracedValue *this_local;
  
  internal::CheckedScope::Reset((CheckedScope *)&this->field_0x10);
  annotation = this->annotation_;
  event_context = this->event_context_;
  parent_scope = internal::CheckedScope::parent_scope((CheckedScope *)&this->field_0x10);
  TracedArray::TracedArray(__return_storage_ptr__,annotation,event_context,parent_scope);
  return __return_storage_ptr__;
}

Assistant:

TracedArray TracedValue::WriteArray() && {
  // Note: this passes |checked_scope_.is_active_| bit to the parent to be
  // picked up later by the new TracedDictionary.
  PERFETTO_DCHECK(checked_scope_.is_active());
  checked_scope_.Reset();

  PERFETTO_DCHECK(!annotation_->is_finalized());
  return TracedArray(annotation_, event_context_,
                     checked_scope_.parent_scope());
}